

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O3

VPointF __thiscall
rlottie::internal::model::KeyFrames<VPointF,_void>::value
          (KeyFrames<VPointF,_void> *this,int frameNo)

{
  VPointF VVar1;
  pointer pFVar2;
  pointer pFVar3;
  VPointF VVar4;
  VPointF VVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar6 = (float)frameNo;
  pFVar3 = (this->frames_).
           super__Vector_base<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (fVar6 <= pFVar3->start_) {
    return (pFVar3->value_).start_;
  }
  pFVar2 = (this->frames_).
           super__Vector_base<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<VPointF,_void>::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar2[-1].end_ <= fVar6) {
    VVar4 = pFVar2[-1].value_.end_;
  }
  else {
    VVar4.mx = 0.0;
    VVar4.my = 0.0;
    for (; pFVar3 != pFVar2; pFVar3 = pFVar3 + 1) {
      if ((pFVar3->start_ <= fVar6) && (fVar6 < pFVar3->end_)) {
        if (pFVar3->interpolator_ == (VInterpolator *)0x0) {
          fVar6 = 0.0;
        }
        else {
          fVar6 = VInterpolator::value
                            (pFVar3->interpolator_,
                             ((float)frameNo - pFVar3->start_) / (pFVar3->end_ - pFVar3->start_));
        }
        VVar4 = (pFVar3->value_).start_;
        VVar1 = (pFVar3->value_).end_;
        fVar7 = VVar4.mx;
        fVar8 = VVar4.my;
        VVar5.mx = fVar6 * (VVar1.mx - fVar7) + fVar7;
        VVar5.my = fVar6 * (VVar1.my - fVar8) + fVar8;
        return VVar5;
      }
    }
  }
  return VVar4;
}

Assistant:

T value(int frameNo) const
    {
        if (frames_.front().start_ >= frameNo)
            return frames_.front().value_.start_;
        if (frames_.back().end_ <= frameNo) return frames_.back().value_.end_;

        for (const auto &keyFrame : frames_) {
            if (frameNo >= keyFrame.start_ && frameNo < keyFrame.end_)
                return keyFrame.value(frameNo);
        }
        return {};
    }